

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

int asl::utf16toUtf8(wchar_t *p,char *u,int n)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  int iVar4;
  char cVar5;
  byte bVar6;
  uint uVar7;
  
  iVar4 = (int)u;
  do {
    pwVar3 = p + 1;
    wVar1 = *p;
    cVar5 = '\x03';
    if (wVar1 == L'\0') goto LAB_0011907d;
    bVar6 = (byte)wVar1;
    if (wVar1 < L'\x80') {
      *u = bVar6;
      u = (char *)((byte *)u + 1);
LAB_0011906f:
      n = n + -1;
      cVar5 = (n == 0) * '\x03';
    }
    else {
      if (wVar1 < L'ࠀ') {
        *u = (byte)((uint)wVar1 >> 6) | 0xc0;
        ((byte *)u)[1] = bVar6 & 0x3f | 0x80;
        u = (char *)((byte *)u + 2);
        goto LAB_0011906f;
      }
      if ((uint)(wVar1 + L'\xffff2000') < 0xfffff800) {
        *u = (byte)((uint)wVar1 >> 0xc) | 0xe0;
        ((byte *)u)[1] = (byte)((uint)wVar1 >> 6) & 0x3f | 0x80;
        ((byte *)u)[2] = bVar6 & 0x3f | 0x80;
        u = (char *)((byte *)u + 3);
        goto LAB_0011906f;
      }
      if (wVar1 < L'\xdc00') {
        wVar2 = p[1];
        if ((wVar2 & 0xfffffc00U) == 0xdc00) {
          uVar7 = wVar1 * 0x400 + wVar2 + 0xfca02400;
          *u = (byte)(uVar7 >> 0x12) | 0xf0;
          ((byte *)u)[1] = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
          ((byte *)u)[2] = (byte)((uint)(wVar2 + wVar1 * 0x400 + 0x400U) >> 6) & 0x3f | 0x80;
          ((byte *)u)[3] = (byte)wVar2 & 0x3f | 0x80;
          u = (char *)((byte *)u + 4);
          cVar5 = '\0';
        }
        pwVar3 = p + 2;
        if ((wVar2 & 0xfffffc00U) == 0xdc00) goto LAB_0011906f;
      }
    }
LAB_0011907d:
    p = pwVar3;
    if (cVar5 != '\0') {
      *u = 0;
      return (int)u - iVar4;
    }
  } while( true );
}

Assistant:

int utf16toUtf8(const wchar_t* p, char* u, int n)
{
	const char* u0 = u;
	while(wchar_t c = *p++) {
		if(c < 0x80) {
			*u++ = c & 0xff;
		}
		else if (c < 0x0800) {
			*u++ = (c >> 6 | 0xC0);
			*u++ = ((c & 0x3F) | 0x80);
		}
		else if (c < 0xd800 || c > 0xdfff) {
			*u++ = (c >> 12 | 0xE0);
			*u++ = ((c >> 6 & 0x3F) | 0x80);
			*u++ = ((c & 0x3F) | 0x80);
		}
		else if (c < 0xdc00) { // 1st surrogate
			int c2 = *p++;
			if (c2 < 0xdc00 || c2 > 0xdfff)
				break;
			unsigned int d = ((((unsigned int)c - 0xd800) << 10) | (c2 - 0xdc00)) + 0x10000;
			*u++ = (d >> 18 | 0xF0);
			*u++ = ((d >> 12 & 0x3F) | 0x80);
			*u++ = ((d >> 6 & 0x3F) | 0x80);
			*u++ = ((d & 0x3F) | 0x80);
		}
		else
			break;
		if (--n == 0)
			break;
	}
	*u='\0';
	return int(u - u0);
}